

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall
vkb::PhysicalDevice::enable_extensions_if_present
          (PhysicalDevice *this,vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  char *__s;
  bool bVar1;
  reference ppcVar2;
  allocator<char> local_a9;
  value_type local_a8;
  char *local_88;
  char *extension_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  char *extension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> *extensions_local;
  PhysicalDevice *this_local;
  
  __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(extensions);
  extension = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(extensions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                *)&extension);
    if (!bVar1) {
      __end1_1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(extensions);
      extension_1 = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                      (extensions);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                 *)&extension_1), bVar1) {
        ppcVar2 = __gnu_cxx::
                  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                  ::operator*(&__end1_1);
        __s = *ppcVar2;
        local_88 = __s;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s,&local_a9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->extensions_to_enable,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator(&local_a9);
        __gnu_cxx::
        __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
        ::operator++(&__end1_1);
      }
      return true;
    }
    ppcVar2 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&__end1);
    it._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppcVar2;
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   (&this->available_extensions);
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (&this->available_extensions);
    local_60 = it._M_current;
    local_48 = std::
               find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,vkb::PhysicalDevice::enable_extensions_if_present(std::vector<char_const*,std::allocator<char_const*>>const&)::__0>
                         (local_50,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_58,it._M_current);
    __range1_1 = (vector<const_char_*,_std::allocator<const_char_*>_> *)
                 std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           (&this->available_extensions);
    bVar1 = __gnu_cxx::operator==
                      (&local_48,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range1_1);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool PhysicalDevice::enable_extensions_if_present(const std::vector<const char*>& extensions) {
    for (const auto extension : extensions) {
        auto it = std::find_if(std::begin(available_extensions),
            std::end(available_extensions),
            [extension](std::string const& ext_name) { return ext_name == extension; });
        if (it == std::end(available_extensions)) return false;
    }
    for (const auto extension : extensions)
        extensions_to_enable.push_back(extension);
    return true;
}